

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O0

ASMFunction lj_dispatch_call(lua_State *L,BCIns *pc)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  lua_State *L_00;
  ulong in_RSI;
  long in_RDI;
  bool bVar4;
  int i;
  int missing;
  jit_State *J;
  global_State *g;
  BCOp op;
  GCfunc *fn;
  int olderr;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar5;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar6;
  TValue **fn_00;
  uint local_24;
  ulong local_10;
  
  piVar3 = __errno_location();
  iVar5 = *piVar3;
  L_00 = (lua_State *)(ulong)*(uint *)(in_RDI + 8);
  fn_00 = &L_00[6].top;
  iVar2 = call_init(L_00,(GCfunc *)fn_00);
  fn_00[0xc] = (TValue *)in_RDI;
  if ((in_RSI & 1) == 0) {
    if ((*(int *)((long)fn_00 + 0xbc) != 0) && (((ulong)L_00[2].base & 0x6000) == 0)) {
      lj_trace_ins((jit_State *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                   (BCIns *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
    local_10 = in_RSI;
    if (((ulong)L_00[2].base & 0x100) != 0) {
      for (iVar6 = 0; iVar6 < iVar2; iVar6 = iVar6 + 1) {
        lVar1 = *(long *)(in_RDI + 0x18);
        *(long *)(in_RDI + 0x18) = lVar1 + 8;
        *(undefined4 *)(lVar1 + 4) = 0xffffffff;
      }
      callhook(L,pc._4_4_,(BCLine)pc);
      while( true ) {
        bVar4 = false;
        if (0 < iVar2) {
          bVar4 = *(int *)(*(long *)(in_RDI + 0x18) + -4) == -1;
        }
        if (!bVar4) break;
        *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + -8;
        iVar2 = iVar2 + -1;
      }
    }
  }
  else {
    local_10 = in_RSI & 0xfffffffffffffffe;
    lj_trace_hot((jit_State *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                 (BCIns *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  local_24 = *(uint *)(local_10 - 4) & 0xff;
  if ((((*(uint *)(fn_00 + 0x11) & 1) == 0) || (*(int *)((long)fn_00 + 0xbc) != 0)) &&
     ((local_24 == 0x55 || (local_24 == 0x58)))) {
    local_24 = local_24 + 1;
  }
  piVar3 = __errno_location();
  *piVar3 = iVar5;
  return lj_BC_ISLT + (int)(uint)lj_bc_ofs[local_24];
}

Assistant:

ASMFunction LJ_FASTCALL lj_dispatch_call(lua_State *L, const BCIns *pc)
{
  ERRNO_SAVE
  GCfunc *fn = curr_func(L);
  BCOp op;
  global_State *g = G(L);
#if LJ_HASJIT
  jit_State *J = G2J(g);
#endif
  int missing = call_init(L, fn);
#if LJ_HASJIT
  J->L = L;
  if ((uintptr_t)pc & 1) {  /* Marker for hot call. */
#ifdef LUA_USE_ASSERT
    ptrdiff_t delta = L->top - L->base;
#endif
    pc = (const BCIns *)((uintptr_t)pc & ~(uintptr_t)1);
    lj_trace_hot(J, pc);
    lua_assert(L->top - L->base == delta);
    goto out;
  } else if (J->state != LJ_TRACE_IDLE &&
	     !(g->hookmask & (HOOK_GC|HOOK_VMEVENT))) {
#ifdef LUA_USE_ASSERT
    ptrdiff_t delta = L->top - L->base;
#endif
    /* Record the FUNC* bytecodes, too. */
    lj_trace_ins(J, pc-1);  /* The interpreter bytecode PC is offset by 1. */
    lua_assert(L->top - L->base == delta);
  }
#endif
  if ((g->hookmask & LUA_MASKCALL)) {
    int i;
    for (i = 0; i < missing; i++)  /* Add missing parameters. */
      setnilV(L->top++);
    callhook(L, LUA_HOOKCALL, -1);
    /* Preserve modifications of missing parameters by lua_setlocal(). */
    while (missing-- > 0 && tvisnil(L->top - 1))
      L->top--;
  }
#if LJ_HASJIT
out:
#endif
  op = bc_op(pc[-1]);  /* Get FUNC* op. */
#if LJ_HASJIT
  /* Use the non-hotcounting variants if JIT is off or while recording. */
  if ((!(J->flags & JIT_F_ON) || J->state != LJ_TRACE_IDLE) &&
      (op == BC_FUNCF || op == BC_FUNCV))
    op = (BCOp)((int)op+(int)BC_IFUNCF-(int)BC_FUNCF);
#endif
  ERRNO_RESTORE
  return makeasmfunc(lj_bc_ofs[op]);  /* Return static dispatch target. */
}